

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmGeneratorTarget::GetLanguageStandardRequired(cmGeneratorTarget *this,string *lang)

{
  bool bVar1;
  cmValue cVar2;
  char *extraout_RDX;
  string_view value;
  
  cVar2 = GetPropertyWithPairedLanguageSupport(this,lang,"_STANDARD_REQUIRED");
  if (cVar2.Value != (string *)0x0) {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar2.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)(cVar2.Value)->_M_string_length,value);
    return bVar1;
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::GetLanguageStandardRequired(
  std::string const& lang) const
{
  return this->GetPropertyWithPairedLanguageSupport(lang, "_STANDARD_REQUIRED")
    .IsOn();
}